

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.upb.h
# Opt level: O0

google_protobuf_FileDescriptorProto **
google_protobuf_compiler_CodeGeneratorRequest_proto_file
          (google_protobuf_compiler_CodeGeneratorRequest *msg,size_t *size)

{
  upb_Array *array;
  upb_Array *arr;
  upb_MiniTableField field;
  size_t *size_local;
  google_protobuf_compiler_CodeGeneratorRequest *msg_local;
  
  stack0xffffffffffffffd4 = 0x300000000f;
  field.number_dont_copy_me__upb_internal_use_only = 0xc10b0001;
  field._4_8_ = size;
  _upb_MiniTable_StrongReference_dont_copy_me__upb_internal_use_only
            (&google__protobuf__FileDescriptorProto_msg_init);
  array = upb_Message_GetArray
                    (&msg->base_dont_copy_me__upb_internal_use_only,
                     (upb_MiniTableField *)((long)&arr + 4));
  if (array == (upb_Array *)0x0) {
    if (field._4_8_ != 0) {
      *(undefined8 *)field._4_8_ = 0;
    }
    msg_local = (google_protobuf_compiler_CodeGeneratorRequest *)0x0;
  }
  else {
    if (field._4_8_ != 0) {
      *(size_t *)field._4_8_ = array->size_dont_copy_me__upb_internal_use_only;
    }
    msg_local = (google_protobuf_compiler_CodeGeneratorRequest *)upb_Array_DataPtr(array);
  }
  return (google_protobuf_FileDescriptorProto **)msg_local;
}

Assistant:

UPB_INLINE const struct google_protobuf_FileDescriptorProto* const* google_protobuf_compiler_CodeGeneratorRequest_proto_file(const google_protobuf_compiler_CodeGeneratorRequest* msg, size_t* size) {
  const upb_MiniTableField field = {15, UPB_SIZE(20, 48), 0, 1, 11, (int)kUpb_FieldMode_Array | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&google__protobuf__FileDescriptorProto_msg_init);
  const upb_Array* arr = upb_Message_GetArray(UPB_UPCAST(msg), &field);
  if (arr) {
    if (size) *size = arr->UPB_PRIVATE(size);
    return (const struct google_protobuf_FileDescriptorProto* const*)upb_Array_DataPtr(arr);
  } else {
    if (size) *size = 0;
    return NULL;
  }
}